

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void determine_constants_arrays(Context *ctx)

{
  uint uVar1;
  ConstantsList *pCVar2;
  long lVar3;
  long lVar4;
  int *piVar5;
  size_t len;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  VariableList *pVVar9;
  ConstantsList **ppCVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ConstantsList *tmp;
  undefined8 *puVar14;
  int iVar15;
  ulong auStack_50 [2];
  Context *local_40;
  int local_34;
  
  if (ctx->determined_constants_arrays != 0) {
    return;
  }
  ctx->determined_constants_arrays = 1;
  uVar1 = ctx->constant_count;
  uVar7 = (ulong)uVar1;
  if ((int)uVar1 < 2) {
    return;
  }
  lVar6 = -(uVar7 * 8 + 0x17 & 0xfffffffffffffff0);
  puVar14 = (undefined8 *)((long)auStack_50 + lVar6 + 8);
  ppCVar10 = &ctx->constants;
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    pCVar2 = *ppCVar10;
    if (pCVar2 == (ConstantsList *)0x0) {
      fail(ctx,"BUG: mismatched constant list and count");
      return;
    }
    puVar14[uVar12] = pCVar2;
    ppCVar10 = &pCVar2->next;
  }
  puVar14[uVar7] = 0;
  *(undefined8 *)((long)auStack_50 + lVar6) = 1;
  uVar12 = *(ulong *)((long)auStack_50 + lVar6);
  uVar13 = 0;
  uVar8 = uVar12 & 0xffffffff;
  do {
    while (uVar1 - 1 != uVar13) {
      lVar3 = puVar14[uVar13];
      lVar4 = *(long *)((long)&local_40 + uVar13 * 8 + lVar6);
      uVar13 = uVar13 + 1;
      if (*(int *)(lVar4 + 4) < *(int *)(lVar3 + 4)) {
        *(long *)((long)auStack_50 + uVar13 * 8 + lVar6) = lVar4;
        puVar14[uVar13] = lVar3;
        uVar8 = 0;
      }
    }
    uVar13 = 0;
    iVar15 = (int)uVar8;
    uVar8 = uVar12 & 0xffffffff;
  } while (iVar15 == 0);
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    *(undefined8 *)(puVar14[uVar12] + 0x18) = *(undefined8 *)((long)&local_40 + uVar12 * 8 + lVar6);
  }
  ctx->constants = (ConstantsList *)*puVar14;
  uVar13 = 0;
  *(undefined8 *)((long)auStack_50 + lVar6) = 0xffffffffffffffff;
  uVar12 = *(ulong *)((long)auStack_50 + lVar6);
  uVar8 = uVar12 & 0xffffffff;
  iVar15 = 0;
  local_40 = ctx;
  do {
    if (uVar7 + 1 == uVar13) {
      return;
    }
    piVar5 = (int *)puVar14[uVar13];
    iVar11 = (int)uVar12;
    if (piVar5 == (int *)0x0) {
      if (iVar11 != -1 && 0 < iVar15) {
LAB_001184e8:
        *(undefined8 *)((long)auStack_50 + lVar6) = 0x28;
        len = *(size_t *)((long)auStack_50 + lVar6);
        local_34 = iVar11;
        *(undefined8 *)((long)auStack_50 + lVar6) = 0x1184f6;
        pVVar9 = (VariableList *)Malloc(ctx,len);
        if (pVVar9 == (VariableList *)0x0) {
          return;
        }
        pVVar9->type = MOJOSHADER_UNIFORM_FLOAT;
        pCVar2 = (ConstantsList *)puVar14[local_34];
        iVar11 = (pCVar2->constant).index;
        pVVar9->index = iVar11;
        pVVar9->count = (*(int *)(puVar14[(int)uVar8] + 4) - iVar11) + 1;
        pVVar9->constant = pCVar2;
        pVVar9->used = 0;
        pVVar9->emit_position = -1;
        pVVar9->next = local_40->variables;
        local_40->variables = pVVar9;
        ctx = local_40;
      }
      goto LAB_0011854b;
    }
    if (*piVar5 == 0) {
      if (iVar11 == -1) {
LAB_0011854b:
        uVar12 = uVar13 & 0xffffffff;
      }
      else {
        if (piVar5[1] != *(int *)(puVar14[(int)uVar8] + 4) + 1) {
          if (0 < iVar15) goto LAB_001184e8;
          goto LAB_0011854b;
        }
        iVar15 = iVar15 + 1;
      }
      uVar8 = uVar13 & 0xffffffff;
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static void determine_constants_arrays(Context *ctx)
{
    // Only process this stuff once. This is called after all DEF* opcodes
    //  could have been parsed.
    if (ctx->determined_constants_arrays)
        return;

    ctx->determined_constants_arrays = 1;

    if (ctx->constant_count <= 1)
        return;  // nothing to sort or group.

    // Sort the linked list into an array for easier tapdancing...
    ConstantsList **array = (ConstantsList **) alloca(sizeof (ConstantsList *) * (ctx->constant_count + 1));
    ConstantsList *item = ctx->constants;
    int i;

    for (i = 0; i < ctx->constant_count; i++)
    {
        if (item == NULL)
        {
            fail(ctx, "BUG: mismatched constant list and count");
            return;
        } // if

        array[i] = item;
        item = item->next;
    } // for

    array[ctx->constant_count] = NULL;

    // bubble sort ftw.
    int sorted;
    do
    {
        sorted = 1;
        for (i = 0; i < ctx->constant_count-1; i++)
        {
            if (array[i]->constant.index > array[i+1]->constant.index)
            {
                ConstantsList *tmp = array[i];
                array[i] = array[i+1];
                array[i+1] = tmp;
                sorted = 0;
            } // if
        } // for
    } while (!sorted);

    // okay, sorted. While we're here, let's redo the linked list in order...
    for (i = 0; i < ctx->constant_count; i++)
        array[i]->next = array[i+1];
    ctx->constants = array[0];

    // now figure out the groupings of constants and add to ctx->variables...
    int start = -1;
    int prev = -1;
    int count = 0;
    const int hi = ctx->constant_count;
    for (i = 0; i <= hi; i++)
    {
        if (array[i] && (array[i]->constant.type != MOJOSHADER_UNIFORM_FLOAT))
            continue;  // we only care about REG_TYPE_CONST for array groups.

        if (start == -1)
        {
            prev = start = i;  // first REG_TYPE_CONST we've seen. Mark it!
            continue;
        } // if

        // not a match (or last item in the array)...see if we had a
        //  contiguous set before this point...
        if ( (array[i]) && (array[i]->constant.index == (array[prev]->constant.index + 1)) )
            count++;
        else
        {
            if (count > 0)  // multiple constants in the set?
            {
                VariableList *var;
                var = (VariableList *) Malloc(ctx, sizeof (VariableList));
                if (var == NULL)
                    break;

                var->type = MOJOSHADER_UNIFORM_FLOAT;
                var->index = array[start]->constant.index;
                var->count = (array[prev]->constant.index - var->index) + 1;
                var->constant = array[start];
                var->used = 0;
                var->emit_position = -1;
                var->next = ctx->variables;
                ctx->variables = var;
            } // else

            start = i;   // set this as new start of sequence.
        } // if

        prev = i;
    } // for
}